

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,char (*value) [9])

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *in_RAX;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  
  local_28.ptr_ = in_RAX;
  Message::Message((Message *)&local_28);
  std::operator<<((ostream *)(local_28.ptr_ + 0x10),*value);
  AppendMessage(this,(Message *)&local_28);
  internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_28);
  return this;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }